

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O2

void ppc32be_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  ar_info ai;
  
  if (lf->type != '\b') {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(Elf32_Ehdr *)lf->data,ppc32_reloc_elf2vlink);
    return;
  }
  bVar1 = ar_init(&ai,(char *)lf->data,lf->length,lf->filename);
  if (bVar1 == 0) {
    ierror("ppc32be_readconv(): archive %s corrupted since last access",lf->pathname);
  }
  else {
    while (bVar1 = ar_extract(&ai), bVar1 != 0) {
      pcVar2 = allocstring(ai.name);
      lf->objname = pcVar2;
      elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,'\x01','\x02',1,3,0x14,0x11,0x9025);
      elf32_parse(gv,lf,(Elf32_Ehdr *)ai.data,ppc32_reloc_elf2vlink);
    }
  }
  return;
}

Assistant:

static void ppc32be_readconv(struct GlobalVars *gv,struct LinkFile *lf)
/* Read elfppc32be executable / object / shared obj. */
{
  if (lf->type == ID_LIBARCH) {
    struct ar_info ai;

    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,
                          ELFCLASS32,ELFDATA2MSB,ELF_VER,
                          3,EM_PPC,EM_PPC_OLD,EM_CYGNUS_POWERPC);
        elf32_parse(gv,lf,(struct Elf32_Ehdr *)ai.data,
                    ppc32_reloc_elf2vlink);
      }
    }
    else
      ierror("ppc32be_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(struct Elf32_Ehdr *)lf->data,ppc32_reloc_elf2vlink);
  }
}